

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_scene_wallmarks.cxx
# Opt level: O0

void __thiscall write_wallmark::operator()(write_wallmark *this,wm_object *wm,xr_writer *w)

{
  size_type value;
  xr_writer *w_local;
  wm_object *wm_local;
  write_wallmark *this_local;
  
  xray_re::xr_writer::w_bool(w,(bool)(wm->selected & 1));
  xray_re::xr_writer::w_fvector3(w,(fvector3 *)&wm->bbox);
  xray_re::xr_writer::w_fvector3(w,&(wm->bbox).field_0.field_0.max);
  xray_re::xr_writer::w_fvector3(w,&(wm->bsphere).p);
  xray_re::xr_writer::w_float(w,(wm->bsphere).r);
  xray_re::xr_writer::w_float(w,wm->width);
  xray_re::xr_writer::w_float(w,wm->height);
  xray_re::xr_writer::w_float(w,wm->rotate);
  value = std::vector<xray_re::wm_vertex,_std::allocator<xray_re::wm_vertex>_>::size(&wm->vertices);
  xray_re::xr_writer::w_size_u32(w,value);
  xray_re::xr_writer::w_seq<std::vector<xray_re::wm_vertex,std::allocator<xray_re::wm_vertex>>>
            (w,&wm->vertices);
  return;
}

Assistant:

void operator()(const wm_object& wm, xr_writer& w) const {
	w.w_bool(wm.selected);
	w.w_fvector3(wm.bbox.min);
	w.w_fvector3(wm.bbox.max);
	w.w_fvector3(wm.bsphere.p);
	w.w_float(wm.bsphere.r);
	w.w_float(wm.width);
	w.w_float(wm.height);
	w.w_float(wm.rotate);
	w.w_size_u32(wm.vertices.size());
	w.w_seq(wm.vertices);
}